

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# var_based_part.c
# Opt level: O0

void tune_thresh_based_on_qindex
               (AV1_COMP *cpi,int64_t *thresholds,uint64_t block_sad,int current_qindex,
               int num_pixels,_Bool is_segment_id_boosted,int source_sad_nonrd,int lighting_change)

{
  sbyte sVar1;
  long local_60;
  int fac;
  uint64_t block_sad_high;
  uint64_t block_sad_low;
  uint64_t avg_source_sad_thresh;
  int i;
  int win;
  double weight;
  _Bool is_segment_id_boosted_local;
  int num_pixels_local;
  int current_qindex_local;
  uint64_t block_sad_local;
  int64_t *thresholds_local;
  AV1_COMP *cpi_local;
  
  if ((cpi->sf).rt_sf.prefer_large_partition_blocks < 3) {
    if ((cpi->sf).rt_sf.prefer_large_partition_blocks < 2) {
      if (0 < (cpi->sf).rt_sf.prefer_large_partition_blocks) {
        sVar1 = 1;
        if (source_sad_nonrd < 3) {
          sVar1 = 2;
        }
        if (current_qindex < 0x37) {
          weight = 1.0;
        }
        else if (current_qindex < 0x92) {
          weight = 1.0 - (double)((current_qindex + -0x37) / 0x5a);
        }
        else {
          weight = 0.0;
        }
        thresholds[1] =
             (long)(int)((1.0 - weight) * (double)(thresholds[1] << 1) +
                        weight * (double)thresholds[1]);
        thresholds[2] =
             (long)(int)((1.0 - weight) * (double)(thresholds[2] << 1) +
                        weight * (double)thresholds[2]);
        thresholds[3] =
             (long)(int)((1.0 - weight) * (double)(thresholds[3] << sVar1) +
                        weight * (double)thresholds[3]);
      }
    }
    else {
      sVar1 = 0;
      if (source_sad_nonrd < 3) {
        sVar1 = 2;
      }
      thresholds[1] = thresholds[1] << sVar1;
      if (source_sad_nonrd < 3) {
        local_60 = thresholds[2] * 3;
      }
      else {
        local_60 = thresholds[2];
      }
      thresholds[2] = local_60;
    }
  }
  else {
    if (current_qindex < 0x50) {
      weight = 1.0;
    }
    else if (current_qindex < 0x79) {
      weight = 1.0 - (double)((current_qindex + -0x50) / 0x28);
    }
    else {
      weight = 0.0;
    }
    if (0x4b000 < num_pixels) {
      for (i = 0; i < 4; i = i + 1) {
        thresholds[i] = thresholds[i] << 1;
      }
    }
    if (num_pixels < 0x18c01) {
      thresholds[3] = 0x7fffffffffffffff;
      if (is_segment_id_boosted) {
        thresholds[1] = thresholds[1] << 1;
        thresholds[2] = thresholds[2] << 3;
      }
      else {
        thresholds[1] = thresholds[1] << 2;
        sVar1 = 4;
        if (source_sad_nonrd < 3) {
          sVar1 = 5;
        }
        thresholds[2] = thresholds[2] << sVar1;
      }
      avg_source_sad_thresh = 25000;
      block_sad_high = 50000;
      if (((cpi->svc).temporal_layer_id == 0) && (1 < (cpi->svc).number_temporal_layers)) {
        avg_source_sad_thresh = 40000;
        block_sad_high = 70000;
      }
      if ((((!is_segment_id_boosted) && ((cpi->rc).avg_source_sad < avg_source_sad_thresh)) &&
          (25000 < block_sad)) && ((block_sad < block_sad_high && (lighting_change == 0)))) {
        thresholds[2] = thresholds[2] * 3 >> 2;
        thresholds[3] = thresholds[2] << 3;
      }
    }
    else if (((num_pixels < 0x4b001) || (is_segment_id_boosted)) ||
            ((source_sad_nonrd == 4 && ((cpi->rc).avg_source_sad < 0xc351)))) {
      if (((100 < current_qindex) && (!is_segment_id_boosted)) &&
         ((source_sad_nonrd != 4 || (50000 < (cpi->rc).avg_source_sad)))) {
        thresholds[1] =
             (long)(int)((1.0 - weight) * (double)(thresholds[1] << 2) +
                        weight * (double)thresholds[1]);
        thresholds[2] =
             (long)(int)((1.0 - weight) * (double)(thresholds[2] << 4) +
                        weight * (double)thresholds[2]);
        thresholds[3] = 0x7fffffffffffffff;
      }
    }
    else {
      *thresholds = *thresholds * 3 >> 1;
      thresholds[3] = 0x7fffffffffffffff;
      if (100 < current_qindex) {
        thresholds[1] =
             (long)(int)((1.0 - weight) * (double)(thresholds[1] << 1) +
                        weight * (double)thresholds[1]);
        thresholds[2] =
             (long)(int)((1.0 - weight) * (double)(thresholds[2] << 1) +
                        weight * (double)thresholds[2]);
      }
    }
  }
  if (((cpi->sf).part_sf.disable_8x8_part_based_on_qidx != 0) && (current_qindex < 0x80)) {
    thresholds[3] = 0x7fffffffffffffff;
  }
  return;
}

Assistant:

static inline void tune_thresh_based_on_qindex(
    AV1_COMP *cpi, int64_t thresholds[], uint64_t block_sad, int current_qindex,
    int num_pixels, bool is_segment_id_boosted, int source_sad_nonrd,
    int lighting_change) {
  double weight;
  if (cpi->sf.rt_sf.prefer_large_partition_blocks >= 3) {
    const int win = 20;
    if (current_qindex < QINDEX_LARGE_BLOCK_THR - win)
      weight = 1.0;
    else if (current_qindex > QINDEX_LARGE_BLOCK_THR + win)
      weight = 0.0;
    else
      weight =
          1.0 - (current_qindex - QINDEX_LARGE_BLOCK_THR + win) / (2 * win);
    if (num_pixels > RESOLUTION_480P) {
      for (int i = 0; i < 4; i++) {
        thresholds[i] <<= 1;
      }
    }
    if (num_pixels <= RESOLUTION_288P) {
      thresholds[3] = INT64_MAX;
      if (is_segment_id_boosted == false) {
        thresholds[1] <<= 2;
        thresholds[2] <<= (source_sad_nonrd <= kLowSad) ? 5 : 4;
      } else {
        thresholds[1] <<= 1;
        thresholds[2] <<= 3;
      }
      // Allow for split to 8x8 for superblocks where part of it has
      // moving boundary. So allow for sb with source_sad above threshold,
      // and avoid very large source_sad or high source content, to avoid
      // too many 8x8 within superblock.
      uint64_t avg_source_sad_thresh = 25000;
      uint64_t block_sad_low = 25000;
      uint64_t block_sad_high = 50000;
      if (cpi->svc.temporal_layer_id == 0 &&
          cpi->svc.number_temporal_layers > 1) {
        // Increase the sad thresholds for base TL0, as reference/LAST is
        // 2/4 frames behind (for 2/3 #TL).
        avg_source_sad_thresh = 40000;
        block_sad_high = 70000;
      }
      if (is_segment_id_boosted == false &&
          cpi->rc.avg_source_sad < avg_source_sad_thresh &&
          block_sad > block_sad_low && block_sad < block_sad_high &&
          !lighting_change) {
        thresholds[2] = (3 * thresholds[2]) >> 2;
        thresholds[3] = thresholds[2] << 3;
      }
      // Condition the increase of partition thresholds on the segment
      // and the content. Avoid the increase for superblocks which have
      // high source sad, unless the whole frame has very high motion
      // (i.e, cpi->rc.avg_source_sad is very large, in which case all blocks
      // have high source sad).
    } else if (num_pixels > RESOLUTION_480P && is_segment_id_boosted == false &&
               (source_sad_nonrd != kHighSad ||
                cpi->rc.avg_source_sad > 50000)) {
      thresholds[0] = (3 * thresholds[0]) >> 1;
      thresholds[3] = INT64_MAX;
      if (current_qindex > QINDEX_LARGE_BLOCK_THR) {
        thresholds[1] =
            (int)((1 - weight) * (thresholds[1] << 1) + weight * thresholds[1]);
        thresholds[2] =
            (int)((1 - weight) * (thresholds[2] << 1) + weight * thresholds[2]);
      }
    } else if (current_qindex > QINDEX_LARGE_BLOCK_THR &&
               is_segment_id_boosted == false &&
               (source_sad_nonrd != kHighSad ||
                cpi->rc.avg_source_sad > 50000)) {
      thresholds[1] =
          (int)((1 - weight) * (thresholds[1] << 2) + weight * thresholds[1]);
      thresholds[2] =
          (int)((1 - weight) * (thresholds[2] << 4) + weight * thresholds[2]);
      thresholds[3] = INT64_MAX;
    }
  } else if (cpi->sf.rt_sf.prefer_large_partition_blocks >= 2) {
    thresholds[1] <<= (source_sad_nonrd <= kLowSad) ? 2 : 0;
    thresholds[2] =
        (source_sad_nonrd <= kLowSad) ? (3 * thresholds[2]) : thresholds[2];
  } else if (cpi->sf.rt_sf.prefer_large_partition_blocks >= 1) {
    const int fac = (source_sad_nonrd <= kLowSad) ? 2 : 1;
    if (current_qindex < QINDEX_LARGE_BLOCK_THR - 45)
      weight = 1.0;
    else if (current_qindex > QINDEX_LARGE_BLOCK_THR + 45)
      weight = 0.0;
    else
      weight = 1.0 - (current_qindex - QINDEX_LARGE_BLOCK_THR + 45) / (2 * 45);
    thresholds[1] =
        (int)((1 - weight) * (thresholds[1] << 1) + weight * thresholds[1]);
    thresholds[2] =
        (int)((1 - weight) * (thresholds[2] << 1) + weight * thresholds[2]);
    thresholds[3] =
        (int)((1 - weight) * (thresholds[3] << fac) + weight * thresholds[3]);
  }
  if (cpi->sf.part_sf.disable_8x8_part_based_on_qidx && (current_qindex < 128))
    thresholds[3] = INT64_MAX;
}